

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_newarray(ExecutionEngine *this)

{
  Value operand;
  Value value_00;
  Value value_01;
  VMStack *this_00;
  Frame *this_01;
  ostream *this_02;
  u1 *puVar1;
  Value VVar2;
  undefined4 local_138;
  Value arrayref;
  int local_114;
  int i_7;
  int local_fc;
  int i_6;
  int local_e4;
  int i_5;
  int local_cc;
  int i_4;
  int local_b4;
  int i_3;
  int local_9c;
  int i_2;
  int local_84;
  int i_1;
  int local_70;
  int i;
  u1 *code;
  Value padding;
  Value value;
  ArrayObject *array;
  Value count;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  array._4_4_ = VVar2.type;
  if (array._4_4_ != INT) {
    __assert_fail("count.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x10d2,"void ExecutionEngine::i_newarray()");
  }
  count.printType = VVar2.data._0_4_;
  if (-1 < (int)count.printType) {
    puVar1 = Frame::getCode(this_01,this_01->pc);
    switch(puVar1[1]) {
    case '\x04':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,BOOLEAN);
      for (local_70 = 0; local_70 < (int)count.printType; local_70 = local_70 + 1) {
        ArrayObject::pushValue((ArrayObject *)value.data.object,(Value)ZEXT816(0));
      }
      break;
    case '\x05':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,CHAR);
      for (local_84 = 0; local_84 < (int)count.printType; local_84 = local_84 + 1) {
        ArrayObject::pushValue((ArrayObject *)value.data.object,(Value)ZEXT816(0x200000002));
      }
      break;
    case '\x06':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,FLOAT);
      for (local_9c = 0; local_9c < (int)count.printType; local_9c = local_9c + 1) {
        value_01.type = 5;
        value_01.printType = padding.data.intValue;
        value_01.data.longValue = 0;
        ArrayObject::pushValue((ArrayObject *)value.data.object,value_01);
      }
      break;
    case '\a':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,DOUBLE);
      for (local_b4 = 0; local_b4 < (int)count.printType; local_b4 = local_b4 + 1) {
        value_00.type = 7;
        value_00.printType = padding.data.intValue;
        value_00.data.longValue = 0;
        ArrayObject::pushValue((ArrayObject *)value.data.object,value_00);
      }
      break;
    case '\b':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,BYTE);
      for (local_cc = 0; local_cc < (int)count.printType; local_cc = local_cc + 1) {
        ArrayObject::pushValue((ArrayObject *)value.data.object,(Value)ZEXT816(0x100000001));
      }
      break;
    case '\t':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,SHORT);
      for (local_e4 = 0; local_e4 < (int)count.printType; local_e4 = local_e4 + 1) {
        ArrayObject::pushValue((ArrayObject *)value.data.object,(Value)ZEXT816(0x300000003));
      }
      break;
    case '\n':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,INT);
      for (local_fc = 0; local_fc < (int)count.printType; local_fc = local_fc + 1) {
        ArrayObject::pushValue((ArrayObject *)value.data.object,(Value)ZEXT816(0x400000004));
      }
      break;
    case '\v':
      value.data.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)value.data.object,LONG);
      for (local_114 = 0; local_114 < (int)count.printType; local_114 = local_114 + 1) {
        VVar2.type = 6;
        VVar2.printType = padding.data.intValue;
        VVar2.data.longValue = 0;
        ArrayObject::pushValue((ArrayObject *)value.data.object,VVar2);
      }
    }
    operand.type = 9;
    operand.printType = local_138;
    operand.data.longValue = value.data.longValue;
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 2;
    return;
  }
  this_02 = std::operator<<((ostream *)&std::cerr,"NegativeArraySizeException");
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void ExecutionEngine::i_newarray() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value count = topFrame->popTopOfOperandStack(); // Número de elementos no array
    assert(count.type == ValueType::INT);
    
    if (count.data.intValue < 0) {
        cerr << "NegativeArraySizeException" << endl;
        exit(1);
    }
    
    ArrayObject *array; // array que será criado
    Value value; // elemento que irá popular o array
    value.data.longValue = 0; // inicializando Value com 0s
    
    Value padding; // padding poderá ser usado
    padding.type = ValueType::PADDING;
    
    u1 *code = topFrame->getCode(topFrame->pc);
    switch (code[1]) { // argumento representa tipo do array
        case 4:
            array = new ArrayObject(ValueType::BOOLEAN);
            value.type = ValueType::BOOLEAN;
            value.printType = ValueType::BOOLEAN;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 5:
            array = new ArrayObject(ValueType::CHAR);
            value.type = ValueType::CHAR;
            value.printType = ValueType::CHAR;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 6:
            array = new ArrayObject(ValueType::FLOAT);
            value.type = ValueType::FLOAT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 7:
            array = new ArrayObject(ValueType::DOUBLE);
            value.type = ValueType::DOUBLE;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 8:
            array = new ArrayObject(ValueType::BYTE);
            value.type = ValueType::BYTE;
            value.printType = ValueType::BYTE;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 9:
            array = new ArrayObject(ValueType::SHORT);
            value.type = ValueType::SHORT;
            value.printType = ValueType::SHORT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 10:
            array = new ArrayObject(ValueType::INT);
            value.type = ValueType::INT;
            value.printType = ValueType::INT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 11:
            array = new ArrayObject(ValueType::LONG);
            value.type = ValueType::LONG;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
    }
    
    Value arrayref; // Referencia pro array na pilha de operandos
    arrayref.type = ValueType::REFERENCE;
    arrayref.data.object = array;
    
    topFrame->pushIntoOperandStack(arrayref);
    topFrame->pc += 2;
}